

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O3

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _c,size_t _elemsize,Allocator *_allocator)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  undefined1 auVar10 [16];
  void *ptr;
  void *local_38;
  
  uVar1 = this->dims;
  uVar2 = this->w;
  uVar3 = this->h;
  uVar4 = this->c;
  auVar10._0_4_ = -(uint)(uVar1 == 3);
  auVar10._4_4_ = -(uint)(_w == uVar2);
  auVar10._8_4_ = -(uint)(_h == uVar3);
  auVar10._12_4_ = -(uint)(_c == uVar4);
  iVar6 = movmskps(3,auVar10);
  if ((((iVar6 != 0xf) || (this->elempack != 1)) || (this->allocator != _allocator)) ||
     (this->elemsize != _elemsize)) {
    piVar5 = this->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (this->allocator == (Allocator *)0x0) {
          if (this->data != (void *)0x0) {
            free(this->data);
          }
        }
        else {
          (**(code **)(*(long *)this->allocator + 0x18))();
        }
      }
    }
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->elemsize = _elemsize;
    this->elempack = 1;
    this->allocator = _allocator;
    this->dims = 3;
    this->w = _w;
    this->h = _h;
    this->c = _c;
    uVar7 = ((long)(_h * _w) * _elemsize + 0xf & 0xfffffffffffffff0) / _elemsize;
    this->cstep = uVar7;
    lVar9 = (long)_c * uVar7;
    if (lVar9 != 0) {
      uVar7 = lVar9 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        local_38 = (void *)0x0;
        iVar6 = posix_memalign(&local_38,0x10,uVar7 + 4);
        pvVar8 = (void *)0x0;
        if (iVar6 == 0) {
          pvVar8 = local_38;
        }
      }
      else {
        pvVar8 = (void *)(**(code **)(*(long *)_allocator + 0x10))(_allocator,uVar7 + 4);
      }
      this->data = pvVar8;
      this->refcount = (int *)((long)pvVar8 + uVar7);
      *(undefined4 *)((long)pvVar8 + uVar7) = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, int _h, int _c, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 3 && w == _w && h == _h && c == _c && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 3;
    w = _w;
    h = _h;
    c = _c;

    cstep = alignSize(w * h * elemsize, 16) / elemsize;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}